

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a28a9::BNTest_BadModulus_Test::TestBody(BNTest_BadModulus_Test *this)

{
  UniquePtr<BIGNUM> UVar1;
  UniquePtr<BIGNUM> dv;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BN_MONT_CTX *pBVar5;
  pointer *__ptr;
  char *in_R9;
  char *pcVar6;
  AssertHelper local_78;
  UniquePtr<BN_MONT_CTX> mont;
  AssertHelper local_68;
  string local_60;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> zero;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  
  a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
       a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
      a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&mont);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&gtest_ar_,(AssertionResult *)(anon_var_dwarf_146c22 + 0xc),
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x605,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
         b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
        b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&mont);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x4c5f23,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x606,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
           zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
      if (gtest_ar_.success_) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        BN_zero((BIGNUM *)
                zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
        dv = a;
        UVar1 = b;
        pBVar3 = BN_value_one();
        iVar2 = BN_div((BIGNUM *)
                       dv._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                       (BIGNUM *)
                       UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,
                       (BIGNUM *)
                       zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                       (BN_CTX *)
                       (this->super_BNTest).ctx_._M_t.
                       super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&mont);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "BN_div(a.get(), b.get(), BN_value_one(), zero.get(), ctx())","true","false",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x60b,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          std::__cxx11::string::~string((string *)&local_60);
          if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
              mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)mont._M_t.
                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 8))
                      ();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        UVar1 = a;
        pBVar3 = BN_value_one();
        pBVar4 = BN_value_one();
        iVar2 = BN_mod_mul((BIGNUM *)
                           UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,pBVar4,
                           (BIGNUM *)
                           zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                           (BN_CTX *)
                           (this->super_BNTest).ctx_._M_t.
                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&mont);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "BN_mod_mul(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx())","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x60f,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          std::__cxx11::string::~string((string *)&local_60);
          if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
              mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)mont._M_t.
                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 8))
                      ();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        UVar1 = a;
        pBVar3 = BN_value_one();
        pBVar4 = BN_value_one();
        iVar2 = BN_mod_exp((BIGNUM *)
                           UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,pBVar4,
                           (BIGNUM *)
                           zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                           (BN_CTX *)
                           (this->super_BNTest).ctx_._M_t.
                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&mont);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "BN_mod_exp(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx())","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x613,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          std::__cxx11::string::~string((string *)&local_60);
          if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
              mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)mont._M_t.
                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 8))
                      ();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        UVar1 = a;
        pBVar3 = BN_value_one();
        pBVar4 = BN_value_one();
        pcVar6 = (char *)0x0;
        iVar2 = BN_mod_exp_mont((BIGNUM *)
                                UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                ._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,pBVar4
                                ,(BIGNUM *)
                                 zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                 ._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                (BN_CTX *)
                                (this->super_BNTest).ctx_._M_t.
                                super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                (BN_MONT_CTX *)0x0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&mont);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), __null)"
                     ,"true","false",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x617,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          std::__cxx11::string::~string((string *)&local_60);
          if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
              mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)mont._M_t.
                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 8))
                      ();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        UVar1 = a;
        pBVar3 = BN_value_one();
        pBVar4 = BN_value_one();
        pcVar6 = (char *)0x0;
        iVar2 = BN_mod_exp_mont_consttime
                          ((BIGNUM *)
                           UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,pBVar4,
                           (BIGNUM *)
                           zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                           (BN_CTX *)
                           (this->super_BNTest).ctx_._M_t.
                           super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                           (BN_MONT_CTX *)0x0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&mont);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "BN_mod_exp_mont_consttime( a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), nullptr)"
                     ,"true","false",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x61b,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          std::__cxx11::string::~string((string *)&local_60);
          if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
              mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)mont._M_t.
                                  super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 8))
                      ();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bn_mont_ctx_st,_bssl::internal::Deleter,_true,_true>)
             BN_MONT_CTX_new_for_modulus
                       ((BIGNUM *)
                        zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                        (this->super_BNTest).ctx_._M_t.
                        super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<bn_mont_ctx_st_*,_bssl::internal::Deleter>)
             mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
             (_Head_base<0UL,_bn_mont_ctx_st_*,_false>)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x4db2f4,"true","false",
                     pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x620,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          std::__cxx11::string::~string((string *)&local_60);
          if (local_78.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        pBVar5 = BN_MONT_CTX_new_consttime
                           ((BIGNUM *)
                            b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                            (this->super_BNTest).ctx_._M_t.
                            super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
        std::__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter> *)&mont,pBVar5);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
             mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
             (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x4db2f4,"true","false",
                     pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x624,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          std::__cxx11::string::~string((string *)&local_60);
          if (local_78.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ERR_clear_error();
        iVar2 = BN_set_word((BIGNUM *)
                            b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x10);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_60,(internal *)&gtest_ar_,(AssertionResult *)"BN_set_word(b.get(), 16)",
                     "false","true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x628,local_60._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          std::__cxx11::string::~string((string *)&local_60);
          if (local_78.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          pBVar5 = BN_MONT_CTX_new_for_modulus
                             ((BIGNUM *)
                              b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                              (this->super_BNTest).ctx_._M_t.
                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          std::__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter> *)&mont,pBVar5);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
               mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
               (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x4db2f4,"true","false",
                       pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x62b,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            std::__cxx11::string::~string((string *)&local_60);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ERR_clear_error();
          pBVar5 = BN_MONT_CTX_new_consttime
                             ((BIGNUM *)
                              b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                              (this->super_BNTest).ctx_._M_t.
                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          std::__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter> *)&mont,pBVar5);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
               mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl ==
               (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x4db2f4,"true","false",
                       pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x62f,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            std::__cxx11::string::~string((string *)&local_60);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ERR_clear_error();
          UVar1 = a;
          pBVar3 = BN_value_one();
          pBVar4 = BN_value_one();
          pcVar6 = (char *)0x0;
          iVar2 = BN_mod_exp_mont((BIGNUM *)
                                  UVar1._M_t.
                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,
                                  pBVar4,(BIGNUM *)
                                         b._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                  (BN_CTX *)
                                  (this->super_BNTest).ctx_._M_t.
                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                  (BN_MONT_CTX *)0x0);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 == 0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), __null)"
                       ,"true","false",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x633,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            std::__cxx11::string::~string((string *)&local_60);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ERR_clear_error();
          UVar1 = a;
          pBVar3 = BN_value_one();
          pBVar4 = BN_value_one();
          pcVar6 = (char *)0x0;
          iVar2 = BN_mod_exp_mont_consttime
                            ((BIGNUM *)
                             UVar1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar3,pBVar4,
                             (BIGNUM *)
                             b._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                             (BN_CTX *)
                             (this->super_BNTest).ctx_._M_t.
                             super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                             (BN_MONT_CTX *)0x0);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 == 0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_60,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "BN_mod_exp_mont_consttime( a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), nullptr)"
                       ,"true","false",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x637,local_60._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            std::__cxx11::string::~string((string *)&local_60);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          ERR_clear_error();
        }
        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&mont);
        goto LAB_00280933;
      }
      testing::Message::Message((Message *)&mont);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&gtest_ar_,(AssertionResult *)0x48c0ff,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x607,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&mont);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  std::__cxx11::string::~string((string *)&local_60);
  if ((__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)
      mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)mont._M_t.super___uniq_ptr_impl<bn_mont_ctx_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_bn_mont_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bn_mont_ctx_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_00280933:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&zero);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&b);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a);
  return;
}

Assistant:

TEST_F(BNTest, BadModulus) {
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(b);
  ASSERT_TRUE(zero);

  BN_zero(zero.get());

  EXPECT_FALSE(BN_div(a.get(), b.get(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(
      BN_mod_mul(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(
      BN_mod_exp(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(),
                               zero.get(), ctx(), NULL));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont_consttime(
      a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), nullptr));
  ERR_clear_error();

  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(zero.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  mont.reset(BN_MONT_CTX_new_consttime(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  // Some operations also may not be used with an even modulus.
  ASSERT_TRUE(BN_set_word(b.get(), 16));

  mont.reset(BN_MONT_CTX_new_for_modulus(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  mont.reset(BN_MONT_CTX_new_consttime(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), b.get(),
                               ctx(), NULL));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont_consttime(
      a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), nullptr));
  ERR_clear_error();
}